

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

extent_t *
arena_extent_alloc_large(tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool *zero)

{
  _Bool _Var1;
  extent_t *peVar2;
  arena_t *in_RCX;
  tsdn_t *in_RDX;
  size_t unaff_RBX;
  arena_t *in_RSI;
  tsdn_t *in_RDI;
  arena_t *in_R8;
  szind_t in_stack_00000008;
  _Bool *in_stack_00000010;
  _Bool *in_stack_00000018;
  size_t size;
  extent_t *extent;
  _Bool commit;
  size_t mapped_add;
  szind_t szind;
  extent_hooks_t *extent_hooks;
  tsd_t *tsd;
  uint8_t state;
  szind_t ret;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff20;
  undefined4 uVar4;
  arena_t *arena_00;
  arena_t *r_extent_hooks;
  undefined1 slab;
  size_t in_stack_ffffffffffffff38;
  cache_bin_stats_t *pad;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 slab_00;
  extent_hooks_t **in_stack_ffffffffffffff50;
  cache_bin_stats_t *x;
  undefined4 in_stack_ffffffffffffff58;
  extents_t *extents;
  arena_t *paVar5;
  witness_tsd_t *local_60;
  szind_t local_4c;
  tsdn_t *in_stack_ffffffffffffffd0;
  szind_t szind_00;
  tsdn_t *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  tsdn_t *in_stack_fffffffffffffff0;
  
  uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  extents = (extents_t *)0x0;
  if (in_RDI == (tsdn_t *)0x0) {
    local_60 = (witness_tsd_t *)0x0;
  }
  else {
    local_60 = &(in_RDI->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd;
    in_stack_ffffffffffffffd0 = in_RDI;
    in_stack_ffffffffffffffe0 = in_RDI;
  }
  szind_00 = (szind_t)in_stack_ffffffffffffffe0;
  witness_assert_depth_to_rank((witness_tsdn_t *)local_60,0xc,0);
  if (in_RDX < (tsdn_t *)0x1001) {
    local_4c = (szind_t)sz_size2index_tab
                        [(ulong)((long)&(in_RDX->tsd).
                                        cant_access_tsd_items_directly_use_a_getter_or_setter_narenas_tdata
                                + 3U) >> 3];
    in_stack_ffffffffffffffec = local_4c;
    in_stack_fffffffffffffff0 = in_RDX;
  }
  else {
    local_4c = sz_size2index_compute(in_stack_ffffffffffffff38);
  }
  slab_00 = 1;
  slab = (undefined1)((ulong)&stack0xffffffffffffff4f >> 0x38);
  uVar3 = 0;
  arena_00 = (arena_t *)CONCAT44(uVar4,local_4c);
  r_extent_hooks = in_R8;
  peVar2 = extents_alloc(in_RDX,in_RCX,(extent_hooks_t **)in_R8,extents,
                         (void *)CONCAT44(local_4c,in_stack_ffffffffffffff58),
                         (size_t)in_stack_ffffffffffffff50,(size_t)in_stack_fffffffffffffff0,
                         unaff_RBX,true,in_stack_00000008,in_stack_00000010,in_stack_00000018);
  if ((peVar2 == (extent_t *)0x0) && (_Var1 = arena_may_have_muzzy((arena_t *)0x1125bb), _Var1)) {
    slab = (undefined1)((ulong)&stack0xffffffffffffff4f >> 0x38);
    uVar3 = 0;
    arena_00 = (arena_t *)CONCAT44((int)((ulong)arena_00 >> 0x20),local_4c);
    paVar5 = r_extent_hooks;
    peVar2 = extents_alloc(in_RDX,in_RCX,(extent_hooks_t **)r_extent_hooks,extents,
                           (void *)CONCAT44(local_4c,in_stack_ffffffffffffff58),
                           (size_t)in_stack_ffffffffffffff50,(size_t)in_stack_fffffffffffffff0,
                           unaff_RBX,(_Bool)slab_00,in_stack_00000008,in_stack_00000010,
                           in_stack_00000018);
    in_R8 = r_extent_hooks;
    r_extent_hooks = paVar5;
  }
  pad = &(in_RDX->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.bins_large[0x6c]
         .tstats;
  if (peVar2 == (extent_t *)0x0) {
    in_R8 = (arena_t *)&stack0xffffffffffffff4f;
    peVar2 = extent_alloc_wrapper
                       ((tsdn_t *)extents,(arena_t *)CONCAT44(local_4c,in_stack_ffffffffffffff58),
                        in_stack_ffffffffffffff50,
                        (void *)CONCAT17(slab_00,in_stack_ffffffffffffff48),0,(size_t)pad,
                        (size_t)in_stack_ffffffffffffffd0,(_Bool)slab,szind_00,
                        (_Bool *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (_Bool *)in_stack_fffffffffffffff0);
    uVar3 = local_4c;
    arena_00 = r_extent_hooks;
    x = pad;
  }
  else {
    x = (cache_bin_stats_t *)0x0;
  }
  if (peVar2 != (extent_t *)0x0) {
    arena_stats_lock(in_RDI,&in_RSI->stats);
    arena_large_malloc_stats_update
              ((tsdn_t *)in_R8,arena_00,CONCAT44(in_stack_ffffffffffffff1c,uVar3));
    if (x != (cache_bin_stats_t *)0x0) {
      arena_stats_add_zu(in_RDI,&in_RSI->stats,&(in_RSI->stats).mapped,(size_t)x);
    }
    arena_stats_unlock(in_RDI,&in_RSI->stats);
    arena_nactive_add(in_RSI,(ulong)pad >> 0xc);
  }
  return peVar2;
}

Assistant:

extent_t *
arena_extent_alloc_large(tsdn_t *tsdn, arena_t *arena, size_t usize,
    size_t alignment, bool *zero) {
	extent_hooks_t *extent_hooks = EXTENT_HOOKS_INITIALIZER;

	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	szind_t szind = sz_size2index(usize);
	size_t mapped_add;
	bool commit = true;
	extent_t *extent = extents_alloc(tsdn, arena, &extent_hooks,
	    &arena->extents_dirty, NULL, usize, sz_large_pad, alignment, false,
	    szind, zero, &commit);
	if (extent == NULL && arena_may_have_muzzy(arena)) {
		extent = extents_alloc(tsdn, arena, &extent_hooks,
		    &arena->extents_muzzy, NULL, usize, sz_large_pad, alignment,
		    false, szind, zero, &commit);
	}
	size_t size = usize + sz_large_pad;
	if (extent == NULL) {
		extent = extent_alloc_wrapper(tsdn, arena, &extent_hooks, NULL,
		    usize, sz_large_pad, alignment, false, szind, zero,
		    &commit);
		if (config_stats) {
			/*
			 * extent may be NULL on OOM, but in that case
			 * mapped_add isn't used below, so there's no need to
			 * conditionlly set it to 0 here.
			 */
			mapped_add = size;
		}
	} else if (config_stats) {
		mapped_add = 0;
	}

	if (extent != NULL) {
		if (config_stats) {
			arena_stats_lock(tsdn, &arena->stats);
			arena_large_malloc_stats_update(tsdn, arena, usize);
			if (mapped_add != 0) {
				arena_stats_add_zu(tsdn, &arena->stats,
				    &arena->stats.mapped, mapped_add);
			}
			arena_stats_unlock(tsdn, &arena->stats);
		}
		arena_nactive_add(arena, size >> LG_PAGE);
	}

	return extent;
}